

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool __thiscall
ON_BoundingBox::GetClosestPoint
          (ON_BoundingBox *this,ON_BoundingBox *other_box,ON_3dPoint *this_point,
          ON_3dPoint *other_point)

{
  ON_3dPoint *this_00;
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  int i;
  int i_00;
  ON_3dPoint *this_01;
  ON_BoundingBox *this_02;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ON_Interval intersect;
  ON_Interval Io;
  ON_Interval It;
  ON_BoundingBox b;
  double local_d0;
  ON_Interval local_c8;
  ON_Interval local_b8;
  ON_3dPoint *local_a8;
  ON_3dPoint *local_a0;
  ON_Interval local_98;
  ON_Interval local_80;
  ON_Interval local_70;
  ON_BoundingBox local_60;
  
  local_a8 = this_point;
  local_a0 = other_point;
  ON_BoundingBox(&local_60);
  bVar3 = IsNotEmpty(this);
  if (bVar3) {
    bVar3 = IsNotEmpty(other_box);
    i_00 = 0;
    if (bVar3) {
      this_00 = &this->m_max;
      do {
        dVar1 = ON_3dPoint::operator[](&this->m_min,i_00);
        dVar2 = ON_3dPoint::operator[](this_00,i_00);
        ON_Interval::ON_Interval(&local_70,dVar1,dVar2);
        dVar1 = ON_3dPoint::operator[](&other_box->m_min,i_00);
        dVar2 = ON_3dPoint::operator[](&other_box->m_max,i_00);
        ON_Interval::ON_Interval(&local_80,dVar1,dVar2);
        ON_Interval::ON_Interval(&local_98);
        local_b8.m_t[0] = local_70.m_t[0];
        local_b8.m_t[1] = local_70.m_t[1];
        local_c8.m_t[0] = local_80.m_t[0];
        local_c8.m_t[1] = local_80.m_t[1];
        bVar3 = ON_Interval::IsDecreasing(&local_b8);
        if (bVar3) {
          ON_Interval::Swap(&local_b8);
        }
        bVar3 = ON_Interval::IsDecreasing(&local_c8);
        if (bVar3) {
          ON_Interval::Swap(&local_c8);
        }
        uVar5 = SUB84(local_b8.m_t[0],0);
        uVar6 = (undefined4)((ulong)local_b8.m_t[0] >> 0x20);
        uVar8 = (undefined4)((ulong)local_b8.m_t[1] >> 0x20);
        if (((local_c8.m_t[0] < local_b8.m_t[0]) || (local_b8.m_t[1] < local_c8.m_t[0])) ||
           (uVar7 = SUB84(local_b8.m_t[1],0), uVar9 = uVar8, local_c8.m_t[1] < local_b8.m_t[1])) {
          uVar7 = SUB84(local_c8.m_t[1],0);
          uVar9 = (undefined4)((ulong)local_c8.m_t[1] >> 0x20);
          if (((local_c8.m_t[0] <= local_b8.m_t[0]) && (local_b8.m_t[0] <= local_c8.m_t[1])) &&
             (local_c8.m_t[1] <= local_b8.m_t[1])) goto LAB_003e3016;
          if (((local_b8.m_t[0] <= local_c8.m_t[0]) && (local_c8.m_t[0] <= local_c8.m_t[1])) &&
             (local_c8.m_t[1] <= local_b8.m_t[1])) goto LAB_003e2fea;
          if (((local_c8.m_t[0] <= local_b8.m_t[0]) && (local_b8.m_t[0] <= local_b8.m_t[1])) &&
             (uVar7 = SUB84(local_b8.m_t[1],0), uVar9 = uVar8, local_b8.m_t[1] <= local_c8.m_t[1]))
          goto LAB_003e3016;
          if ((local_c8.m_t[0] <= local_b8.m_t[1]) && (local_b8.m_t[0] <= local_c8.m_t[1]))
          goto LAB_003e301b;
          local_98.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
          local_98.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
          dVar1 = ON_3dPoint::operator[](this_00,i_00);
          dVar2 = ON_3dPoint::operator[](&other_box->m_min,i_00);
          if (dVar2 <= dVar1) {
            dVar1 = ON_3dPoint::operator[](&this->m_min,i_00);
            pdVar4 = ON_3dPoint::operator[](local_a8,i_00);
            *pdVar4 = dVar1;
            this_02 = (ON_BoundingBox *)&other_box->m_max;
          }
          else {
            dVar1 = ON_3dPoint::operator[](this_00,i_00);
            pdVar4 = ON_3dPoint::operator[](local_a8,i_00);
            *pdVar4 = dVar1;
            this_02 = other_box;
          }
          local_d0 = ON_3dPoint::operator[](&this_02->m_min,i_00);
          this_01 = local_a0;
        }
        else {
LAB_003e2fea:
          uVar5 = SUB84(local_c8.m_t[0],0);
          uVar6 = (undefined4)((ulong)local_c8.m_t[0] >> 0x20);
LAB_003e3016:
          ON_Interval::Set(&local_98,(double)CONCAT44(uVar6,uVar5),(double)CONCAT44(uVar9,uVar7));
LAB_003e301b:
          local_d0 = ON_Interval::Mid(&local_98);
          pdVar4 = ON_3dPoint::operator[](local_a0,i_00);
          *pdVar4 = local_d0;
          this_01 = local_a8;
        }
        pdVar4 = ON_3dPoint::operator[](this_01,i_00);
        *pdVar4 = local_d0;
        i_00 = i_00 + 1;
      } while (i_00 != 3);
      i_00 = 1;
    }
  }
  else {
    i_00 = 0;
  }
  return SUB41(i_00,0);
}

Assistant:

bool ON_BoundingBox::GetClosestPoint( 
       const ON_BoundingBox& other_box, // "other" bounding box
       ON_3dPoint& this_point, // point on "this" box that is closest to "other" box
       ON_3dPoint& other_point // point on "other" box that is closest to "this" box
       )  const
{
  ON_BoundingBox b;
	if ( !IsValid() || !other_box.IsValid() )
		return false;

	for (int i=0; i<3; i++ )
  {
		ON_Interval It(m_min[i],m_max[i]);
		ON_Interval Io(other_box.m_min[i],other_box.m_max[i]);
		ON_Interval intersect;
		bool NotEmpty = Intersect(It,Io,intersect);
		if(NotEmpty)
    {
			this_point[i] = other_point[i] = intersect.Mid();
		} 
    else {
			if(m_max[i]< other_box.m_min[i] )
      {
				this_point[i] = m_max[i];
				other_point[i] = other_box.m_min[i];
			} 
      else {
				this_point[i] = m_min[i];
				other_point[i] = other_box.m_max[i];
			}
		}
	}
	return true;
}